

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingScheme.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::EncodingScheme::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EncodingScheme *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Encoding Scheme:");
  poVar1 = std::operator<<(poVar1,"\n\tClass:    ");
  ENUMS::GetEnumAsStringEncodingClass_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)((this->m_EncodingSchemeUnion).m_ui16EncodingScheme >> 0xe),
             Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\n\tType:     ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->m_EncodingSchemeUnion).m_ui16EncodingScheme & 0x3fff);
  poVar1 = std::operator<<(poVar1,"\n\tTDL:      ");
  ENUMS::GetEnumAsStringTDLType_abi_cxx11_(&local_1e0,(ENUMS *)(ulong)this->m_ui16TDLType,Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString EncodingScheme::GetAsString() const
{
    KStringStream ss;

    ss << "Encoding Scheme:"
       << "\n\tClass:    " << GetEnumAsStringEncodingClass( m_EncodingSchemeUnion.m_ui16Class )
       << "\n\tType:     " << m_EncodingSchemeUnion.m_ui16Type
       << "\n\tTDL:      " << GetEnumAsStringTDLType( m_ui16TDLType )
       << "\n";

    return ss.str();
}